

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool IsFileInDir(string *infile,string *indir)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  string dir;
  string file;
  string local_78;
  string local_58;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  cmsys::SystemTools::CollapseFullPath(&local_58,infile);
  cmsys::SystemTools::CollapseFullPath(&local_78,indir);
  sVar1 = local_78._M_string_length;
  if (local_78._M_string_length < local_58._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)&local_58);
    if (local_30 == local_78._M_string_length) {
      if (local_30 != 0) {
        iVar2 = bcmp(local_38,local_78._M_dataplus._M_p,local_30);
        if (iVar2 != 0) goto LAB_002815f9;
      }
      bVar3 = local_58._M_dataplus._M_p[local_78._M_string_length] == '/';
      goto LAB_002815fb;
    }
  }
LAB_002815f9:
  bVar3 = false;
LAB_002815fb:
  if ((sVar1 < local_58._M_string_length) && (local_38 != local_28)) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool IsFileInDir(const std::string &infile, const std::string &indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  if (
    file.size() > dir.size() &&
    (fnc(file.substr(0, dir.size())) == fnc(dir)) &&
    file[dir.size()] == '/'
    )
    {
    return true;
    }

  return false;
}